

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

boolean teleport_sink(void)

{
  undefined1 *puVar1;
  level *plVar2;
  level *plVar3;
  uint uVar4;
  long lVar5;
  trap *ptVar6;
  long lVar7;
  int x;
  uint uVar8;
  ulong uVar9;
  
  plVar2 = level;
  lVar5 = (long)u.ux;
  lVar7 = (long)u.uy;
  uVar8 = 0;
  do {
    uVar4 = mt_random();
    uVar9 = (ulong)(uVar4 % 0x4f);
    uVar4 = mt_random();
    plVar3 = level;
    uVar4 = uVar4 % 0x15;
    x = (int)(uVar9 + 1);
    ptVar6 = t_at(level,x,uVar4);
    if ((plVar3->locations[uVar9 + 1][uVar4].typ == '\x19') && (ptVar6 == (trap *)0x0)) {
      if (((viz_array[uVar4][uVar9 + 1] & 2U) == 0) || (199 < uVar8)) {
        plVar3->locations[uVar9 + 1][uVar4].typ = '\x1f';
        *(uint *)&plVar3->locations[uVar9 + 1][uVar4].field_0x6 =
             *(uint *)&plVar3->locations[uVar9 + 1][uVar4].field_0x6 & 0xfffffe0f |
             *(uint *)&plVar2->locations[lVar5][lVar7].field_0x6 & 0x1f0;
        newsym(x,uVar4);
        plVar2->locations[lVar5][lVar7].typ = '\x19';
        puVar1 = &plVar2->locations[lVar5][lVar7].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        newsym((int)u.ux,(int)u.uy);
        return '\x01';
      }
    }
    else if (199 < uVar8) {
      return '\0';
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static boolean teleport_sink(void)
{
	int cx, cy;
	int cnt = 0;
	struct rm *thisloc, *rndloc;
	struct trap *trp;

	thisloc = &level->locations[u.ux][u.uy];
	do {
	    cx = rnd(COLNO - 1);
	    cy = rn2(ROWNO);
	    rndloc = &level->locations[cx][cy];
	    trp = t_at(level, cx, cy);
	} while ((rndloc->typ != ROOM || trp || cansee(cx, cy)) && cnt++ < 200);

	if (rndloc->typ == ROOM && !trp) {
	    /* create sink at new position */
	    rndloc->typ = SINK;
	    rndloc->looted = thisloc->looted;
	    newsym(cx, cy);
	    /* remove old sink */
	    thisloc->typ = ROOM;
	    thisloc->looted = 0;
	    newsym(u.ux, u.uy);
	    return TRUE;
	}

	return FALSE;
}